

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# incppect.cpp
# Opt level: O1

bool __thiscall Incppect<true>::Impl::hasExt(Impl *this,string_view file,string_view ext)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = ext._M_len;
  uVar5 = file._M_len;
  if (uVar3 <= uVar5) {
    if (uVar3 == 0) {
      return uVar3 == 0;
    }
    if (ext._M_str[uVar3 - 1] == file._M_str[uVar5 - 1]) {
      lVar4 = 0;
      do {
        bVar6 = 1 - uVar3 == lVar4;
        if (bVar6) {
          return bVar6;
        }
        lVar2 = lVar4 + (uVar3 - 2);
        lVar1 = lVar4 + (uVar5 - 2);
        lVar4 = lVar4 + -1;
      } while (ext._M_str[lVar2] == file._M_str[lVar1]);
    }
  }
  return false;
}

Assistant:

inline bool hasExt(std::string_view file, std::string_view ext) {
        if (ext.size() > file.size()) {
            return false;
        }
        return std::equal(ext.rbegin(), ext.rend(), file.rbegin());
    }